

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManReverseLevel(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint *puVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  
  uVar1 = p->nObjs;
  uVar14 = (ulong)uVar1;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar13 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar13 = uVar1;
  }
  pVVar6->nCap = uVar13;
  if (uVar13 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar13 << 2);
    pVVar6->pArray = __s;
    pVVar6->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar1 << 2);
      goto LAB_0023fabd;
    }
  }
  __s = (int *)0x0;
LAB_0023fabd:
  if (1 < (int)uVar1) {
    iVar2 = p->nObjs;
    uVar10 = uVar14 + 1;
    lVar5 = uVar14 * 3;
    do {
      uVar7 = uVar10 - 1;
      if ((long)iVar2 < (long)uVar7) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return pVVar6;
      }
      uVar12 = *(undefined8 *)(&pGVar3[-1].field_0x0 + lVar5 * 4);
      uVar13 = (uint)uVar12;
      if ((~uVar13 & 0x1fffffff) == 0 || (int)uVar13 < 0) goto LAB_0023fc46;
      if (uVar14 < uVar7) goto LAB_0023fcf6;
      iVar9 = __s[uVar10 - 2];
      puVar4 = p->pMuxes;
      if ((puVar4 == (uint *)0x0) || (puVar4[uVar10 - 2] == 0)) {
        uVar13 = uVar13 & 0x1fffffff;
        uVar11 = (uint)((ulong)uVar12 >> 0x20) & 0x1fffffff;
        if (uVar13 < uVar11) {
          uVar16 = (-uVar13 + uVar10) - 2;
          uVar13 = (uint)uVar16;
          if (((int)uVar13 < 0) || (uVar1 <= uVar13)) goto LAB_0023fcf6;
          uVar16 = uVar16 & 0xffffffff;
          if (__s[uVar16] < iVar9 + 2) {
            __s[uVar16] = iVar9 + 2;
            uVar11 = *(uint *)(&pGVar3[-1].field_0x4 + lVar5 * 4) & 0x1fffffff;
          }
          uVar16 = (uVar10 + -uVar11) - 2;
          uVar13 = (uint)uVar16;
          if (((int)uVar13 < 0) || (uVar1 <= uVar13)) goto LAB_0023fcf6;
          uVar16 = uVar16 & 0xffffffff;
          goto LAB_0023fc3c;
        }
        uVar16 = (uVar10 + -uVar13) - 2;
        uVar15 = (uint)uVar16;
        if (uVar13 != 0x1fffffff && uVar13 == uVar11) {
          if (((int)uVar15 < 0) || (uVar1 <= uVar15)) goto LAB_0023fcf6;
          uVar16 = uVar16 & 0xffffffff;
          if (iVar9 <= __s[uVar16]) goto LAB_0023fc46;
          goto LAB_0023fc42;
        }
        if (((int)uVar15 < 0) || (uVar1 <= uVar15)) goto LAB_0023fcf6;
        if (__s[uVar16 & 0xffffffff] <= iVar9) {
          __s[uVar16 & 0xffffffff] = iVar9 + 1;
          uVar11 = *(uint *)(&pGVar3[-1].field_0x4 + lVar5 * 4) & 0x1fffffff;
        }
        uVar10 = (uVar10 + -uVar11) - 2;
        uVar13 = (uint)uVar10;
        if (((int)uVar13 < 0) || (uVar1 <= uVar13)) goto LAB_0023fcf6;
        uVar10 = uVar10 & 0xffffffff;
        if (__s[uVar10] <= iVar9) {
          __s[uVar10] = iVar9 + 1;
        }
      }
      else {
        uVar16 = (-(uVar13 & 0x1fffffff) + uVar10) - 2;
        uVar13 = (uint)uVar16;
        if (((int)uVar13 < 0) || (uVar1 <= uVar13)) {
LAB_0023fcf6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar8 = iVar9 + 2;
        uVar16 = uVar16 & 0xffffffff;
        if (__s[uVar16] < iVar8) {
          __s[uVar16] = iVar8;
          uVar12 = *(undefined8 *)(&pGVar3[-1].field_0x0 + lVar5 * 4);
        }
        uVar16 = (-((uint)((ulong)uVar12 >> 0x20) & 0x1fffffff) + uVar10) - 2;
        uVar13 = (uint)uVar16;
        if (((int)uVar13 < 0) || (uVar1 <= uVar13)) goto LAB_0023fcf6;
        uVar16 = uVar16 & 0xffffffff;
        if (__s[uVar16] < iVar8) {
          __s[uVar16] = iVar8;
        }
        uVar13 = puVar4[uVar10 - 2];
        if (uVar13 == 0) goto LAB_0023fcf6;
        if ((int)uVar13 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar16 = (ulong)(uVar13 >> 1);
        if (uVar1 <= uVar13 >> 1) goto LAB_0023fcf6;
LAB_0023fc3c:
        iVar9 = iVar9 + 2;
        if (__s[uVar16] < iVar9) {
LAB_0023fc42:
          __s[uVar16] = iVar9;
        }
      }
LAB_0023fc46:
      uVar10 = uVar7;
      lVar5 = lVar5 + -3;
    } while (2 < uVar7);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Gia_ManReverseLevel( Gia_Man_t * p )  
{
    Vec_Int_t * vLevelRev;
    Gia_Obj_t * pObj;
    int i;
    vLevelRev = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAndReverse( p, pObj, i )
    {
        int LevelR = Vec_IntEntry( vLevelRev, i );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId2(p, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsXor(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsBuf(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR );
        }
        else
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 1 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 1 );
        }
    }
    return vLevelRev;
}